

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.hpp
# Opt level: O0

State * __thiscall Tiles::initial(Tiles *this)

{
  int iVar1;
  Fatal *this_00;
  Tiles *in_RSI;
  State *in_RDI;
  int i;
  int local_c;
  
  in_RDI->blank = -1;
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    if (*(int *)(in_RSI + (long)local_c * 4) == 0) {
      in_RDI->blank = (char)local_c;
    }
    in_RDI->tiles[local_c] = (char)*(undefined4 *)(in_RSI + (long)local_c * 4);
  }
  if (in_RDI->blank < '\0') {
    this_00 = (Fatal *)__cxa_allocate_exception(0x80);
    Fatal::Fatal(this_00,"No blank tile");
    __cxa_throw(this_00,&Fatal::typeinfo,0);
  }
  iVar1 = mdist(in_RSI,(int)in_RDI->blank,in_RDI->tiles);
  in_RDI->h = (char)iVar1;
  return in_RDI;
}

Assistant:

State initial() const {
        State s;
        s.blank = -1;
        for (int i = 0; i < Ntiles; i++) {
            if (init[i] == 0)
                s.blank = i;
            s.tiles[i] = init[i];
        }
        if (s.blank < 0)
            throw Fatal("No blank tile");
        s.h = mdist(s.blank, s.tiles);
        return s;
    }